

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::to_string_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,GeomCube *geom,uint32_t indent,
          bool closing_brace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  bool bVar3;
  ostream *poVar4;
  uint32_t n;
  Specifier s;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t extraout_EDX_02;
  uint32_t extraout_EDX_03;
  uint32_t extraout_EDX_04;
  uint32_t uVar5;
  stringstream ss;
  string local_208;
  uint32_t local_1e4;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e4 = indent;
  local_1e0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  to_string_abi_cxx11_(&local_1d8,(tinyusdz *)(ulong)*(uint *)(this + 0xa98),s);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Cube \"",7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)(this + 0xa78),*(long *)(this + 0xa80));
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  bVar3 = PrimMetas::authored((PrimMetas *)(this + 0x1a10));
  uVar5 = n_00;
  if (bVar3) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),n_00);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    print_prim_metas_abi_cxx11_(&local_208,this + 0x1a10,(PrimMeta *)(ulong)((int)geom + 1),indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    uVar5 = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_00;
    }
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),uVar5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")\n",2);
    uVar5 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      uVar5 = extraout_EDX_02;
    }
  }
  pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),uVar5);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"{\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"size","");
  uVar5 = (int)geom + 1;
  print_typed_attr<double>
            (&local_208,(TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *)(this + 0x1e68)
             ,&local_1d8,uVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  paVar1 = &local_208.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  print_gprim_predefined<tinyusdz::GeomCube>(&local_208,(GeomCube *)this,uVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  print_props(&local_208,
              (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               *)(this + 0x1970),uVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
  uVar5 = extraout_EDX_03;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    uVar5 = extraout_EDX_04;
  }
  if ((char)local_1e4 != '\0') {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)geom & 0xffffffff),uVar5);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}\n",2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
  }
  psVar2 = local_1e0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar2;
}

Assistant:

std::string to_string(const GeomCube &geom, const uint32_t indent,
                      bool closing_brace) {
  std::stringstream ss;

  ss << pprint::Indent(indent) << to_string(geom.spec) << " Cube \""
     << geom.name << "\"\n";
  if (geom.meta.authored()) {
    ss << pprint::Indent(indent) << "(\n";
    ss << print_prim_metas(geom.meta, indent + 1);
    ss << pprint::Indent(indent) << ")\n";
  }
  ss << pprint::Indent(indent) << "{\n";

  // members
  ss << print_typed_attr(geom.size, "size", indent + 1);

  ss << print_gprim_predefined(geom, indent + 1);

  ss << print_props(geom.props, indent + 1);

  if (closing_brace) {
    ss << pprint::Indent(indent) << "}\n";
  }

  return ss.str();
}